

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

string * __thiscall rcg::System::getVendor_abi_cxx11_(string *__return_storage_ptr__,System *this)

{
  TL_INFO_CMD in_R8D;
  
  std::recursive_mutex::lock(&this->mtx);
  (anonymous_namespace)::cTLGetInfo_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)this->tl,&this->gentl,
             (shared_ptr<const_rcg::GenTLWrapper> *)0x1,in_R8D);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::string System::getVendor()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  return cTLGetInfo(tl, gentl, GenTL::TL_INFO_VENDOR);
}